

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O0

bool __thiscall ON_ArithmeticCalculator::Evaluate(ON_ArithmeticCalculator *this,double *value)

{
  bool local_31;
  double dStack_20;
  bool rc;
  double z;
  double *value_local;
  ON_ArithmeticCalculator *this_local;
  
  dStack_20 = -1.23432101234321e+308;
  z = (double)value;
  if (this->m_pCalc == (ON_ArithmeticCalculatorImplementation *)0x0) {
    local_31 = false;
  }
  else {
    value_local = (double *)this;
    local_31 = ON_ArithmeticCalculatorImplementation::Evaluate
                         (this->m_pCalc,&stack0xffffffffffffffe0);
  }
  if (z != 0.0) {
    *(double *)z = dStack_20;
  }
  return local_31;
}

Assistant:

bool ON_ArithmeticCalculator::Evaluate(double* value)
{
  double z = ON_UNSET_VALUE;
  bool rc = m_pCalc ? m_pCalc->Evaluate(&z) : false;
  if ( value )
    *value = z;
  return rc;
}